

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O1

utf_error utf8::internal::validate_next<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                    (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *it,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         end,uint32_t *code_point)

{
  byte bVar1;
  utf_error uVar2;
  long lVar3;
  uint32_t cp;
  
  bVar1 = *it->_M_current;
  lVar3 = 1;
  if ((char)bVar1 < '\0') {
    lVar3 = 2;
    if (((bVar1 & 0xe0) != 0xc0) && (lVar3 = 3, (bVar1 & 0xf0) != 0xe0)) {
      lVar3 = (ulong)((bVar1 & 0xf8) == 0xf0) << 2;
    }
  }
  uVar2 = (*(code *)(&DAT_00714d94 + *(int *)(&DAT_00714d94 + lVar3 * 4)))
                    (it,end._M_current,&DAT_00714d94 + *(int *)(&DAT_00714d94 + lVar3 * 4));
  return uVar2;
}

Assistant:

utf_error validate_next(octet_iterator& it, octet_iterator end, uint32_t& code_point)
    {
        // Save the original value of it so we can go back in case of failure
        // Of course, it does not make much sense with i.e. stream iterators
        octet_iterator original_it = it;

        uint32_t cp = 0;
        // Determine the sequence length based on the lead octet
        typedef typename std::iterator_traits<octet_iterator>::difference_type octet_difference_type;
        const octet_difference_type length = utf8::internal::sequence_length(it);

        // Get trail octets and calculate the code point
        utf_error err = UTF8_OK;
        switch (length) {
            case 0: 
                return INVALID_LEAD;
            case 1:
                err = utf8::internal::get_sequence_1(it, end, cp);
                break;
            case 2:
                err = utf8::internal::get_sequence_2(it, end, cp);
            break;
            case 3:
                err = utf8::internal::get_sequence_3(it, end, cp);
            break;
            case 4:
                err = utf8::internal::get_sequence_4(it, end, cp);
            break;
        }

        if (err == UTF8_OK) {
            // Decoding succeeded. Now, security checks...
            if (utf8::internal::is_code_point_valid(cp)) {
                if (!utf8::internal::is_overlong_sequence(cp, length)){
                    // Passed! Return here.
                    code_point = cp;
                    ++it;
                    return UTF8_OK;
                }
                else
                    err = OVERLONG_SEQUENCE;
            }
            else 
                err = INVALID_CODE_POINT;
        }

        // Failure branch - restore the original value of the iterator
        it = original_it;
        return err;
    }